

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O1

void __thiscall SessionManager::~SessionManager(SessionManager *this)

{
  pointer ppSVar1;
  MutexFactory *this_00;
  pointer ppSVar2;
  vector<Session_*,_std::allocator<Session_*>_> toDelete;
  vector<Session_*,_std::allocator<Session_*>_> local_30;
  
  this->_vptr_SessionManager = (_func_int **)&PTR__SessionManager_0019fcc8;
  std::vector<Session_*,_std::allocator<Session_*>_>::vector(&local_30,&this->sessions);
  ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar2 = local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  for (; ppSVar2 !=
         local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
         super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    if (*ppSVar2 != (Session *)0x0) {
      (*(*ppSVar2)->_vptr_Session[1])();
    }
  }
  this_00 = MutexFactory::i();
  MutexFactory::recycleMutex(this_00,this->sessionsMutex);
  if (local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
  }
  return;
}

Assistant:

SessionManager::~SessionManager()
{
	std::vector<Session*> toDelete = sessions;
	sessions.clear();

	for (std::vector<Session*>::iterator i = toDelete.begin(); i != toDelete.end(); i++)
	{
		if (*i != NULL) delete *i;
	}

	MutexFactory::i()->recycleMutex(sessionsMutex);
}